

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_FSA_dns.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined4 *puVar1;
  double dVar2;
  N_Vector yp;
  int iVar3;
  uint uVar4;
  undefined8 *puVar5;
  N_Vector y;
  N_Vector p_Var6;
  long *plVar7;
  long *plVar8;
  long lVar9;
  N_Vector p_Var10;
  size_t sVar11;
  FILE *__stream;
  N_Vector *ypS;
  N_Vector *yS;
  char *pcVar12;
  undefined4 uVar13;
  undefined8 unaff_R12;
  int iVar14;
  undefined4 uVar15;
  undefined8 *puVar16;
  void *ida_mem;
  SUNContext ctx;
  sunrealtype t;
  char fname [256];
  void *local_1d0;
  int local_1c4;
  undefined4 local_1c0;
  int local_1bc;
  undefined8 local_1b8;
  undefined8 *local_1b0;
  N_Vector local_1a8;
  double local_1a0;
  sunrealtype local_198;
  undefined8 *local_190;
  N_Vector local_188;
  long *local_180;
  long *local_178;
  long local_170;
  long local_168;
  long *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  char local_138 [8];
  undefined8 uStack_130;
  undefined2 uStack_128;
  char acStack_126 [246];
  
  uVar13 = (undefined4)unaff_R12;
  local_1d0 = (void *)0x0;
  if (argc < 2) {
LAB_00102611:
    WrongArgs(*argv);
LAB_00102619:
    iVar14 = -1;
    uVar15 = 0;
  }
  else {
    pcVar12 = argv[1];
    local_1c4 = strcmp(pcVar12,"-nosensi");
    uVar13 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
    if (local_1c4 == 0) goto LAB_00102619;
    iVar3 = strcmp(pcVar12,"-sensi");
    if ((iVar3 != 0) || (argc != 4)) goto LAB_00102611;
    pcVar12 = argv[2];
    iVar3 = strcmp(pcVar12,"sim");
    iVar14 = 1;
    if (iVar3 != 0) {
      iVar3 = strcmp(pcVar12,"stg");
      iVar14 = 2;
      if (iVar3 != 0) goto LAB_00102611;
    }
    pcVar12 = argv[3];
    iVar3 = strcmp(pcVar12,"t");
    uVar15 = 0;
    if (iVar3 == 0) {
      uVar13 = 0;
      uVar15 = 1;
    }
    else {
      iVar3 = strcmp(pcVar12,"f");
      if (iVar3 != 0) goto LAB_00102611;
    }
  }
  uVar4 = SUNContext_Create(0,&local_1b8);
  if ((int)uVar4 < 0) {
    pcVar12 = "SUNContext_Create";
  }
  else {
    puVar5 = (undefined8 *)malloc(0x20);
    if (puVar5 == (undefined8 *)0x0) {
      main_cold_8();
      return 1;
    }
    *puVar5 = 0x3fa47ae147ae147b;
    puVar5[1] = 0x40c3880000000000;
    *(undefined4 *)(puVar5 + 2) = 0;
    *(undefined4 *)((long)puVar5 + 0x14) = 0x417c9c38;
    *(undefined4 *)(puVar5 + 3) = 0;
    *(undefined4 *)((long)puVar5 + 0x1c) = 0x3fe00000;
    y = (N_Vector)N_VNew_Serial(3,local_1b8);
    if (y == (N_Vector)0x0) {
      main_cold_7();
      return 1;
    }
    puVar16 = *(undefined8 **)((long)y->content + 0x10);
    *puVar16 = 0x3ff0000000000000;
    puVar16[1] = 0;
    puVar16[2] = 0;
    p_Var6 = (N_Vector)N_VClone(y);
    if (p_Var6 == (N_Vector)0x0) {
      main_cold_6();
      return 1;
    }
    puVar16 = *(undefined8 **)((long)p_Var6->content + 0x10);
    *puVar16 = 0x3fb999999999999a;
    puVar16[1] = 0;
    puVar16[2] = 0;
    local_1d0 = (void *)IDACreate(local_1b8);
    if (local_1d0 == (void *)0x0) {
      main_cold_5();
      return 1;
    }
    uVar4 = IDAInit(0,local_1d0,res,y,p_Var6);
    if ((int)uVar4 < 0) {
      pcVar12 = "IDAInit";
    }
    else {
      local_1c0 = uVar13;
      plVar7 = (long *)N_VClone(y);
      puVar16 = *(undefined8 **)(*plVar7 + 0x10);
      *puVar16 = 0x3e45798ee2308c3a;
      puVar16[1] = 0x3d06849b86a12b9b;
      ypS = (N_Vector *)0x3eb0c6f7a0b5ed8d;
      puVar16[2] = 0x3eb0c6f7a0b5ed8d;
      uVar4 = IDASVtolerances(0xa0b5ed8d,local_1d0,plVar7);
      if ((int)uVar4 < 0) {
        pcVar12 = "IDASVtolerances";
      }
      else {
        local_1a0 = (double)CONCAT44(local_1a0._4_4_,uVar15);
        plVar8 = (long *)N_VClone(y);
        puVar1 = *(undefined4 **)(*plVar8 + 0x10);
        *puVar1 = 0;
        puVar1[1] = 0x3ff00000;
        puVar1[2] = 0;
        puVar1[3] = 0x3ff00000;
        *(undefined8 *)(puVar1 + 4) = 0;
        uVar4 = IDASetId(local_1d0,plVar8);
        if ((int)uVar4 < 0) {
          pcVar12 = "IDASetId";
        }
        else {
          uVar4 = IDASetUserData(local_1d0,puVar5);
          if ((int)uVar4 < 0) {
            pcVar12 = "IDASetUserData";
          }
          else {
            lVar9 = SUNDenseMatrix(3,3,local_1b8);
            if (lVar9 == 0) {
              main_cold_4();
              return 1;
            }
            local_160 = plVar8;
            local_170 = SUNLinSol_Dense(y,lVar9,local_1b8);
            if (local_170 == 0) {
              main_cold_3();
              return 1;
            }
            local_168 = lVar9;
            uVar4 = IDASetLinearSolver(local_1d0,local_170,lVar9);
            if ((int)uVar4 < 0) {
              pcVar12 = "IDASetLinearSolver";
            }
            else {
              local_1bc = iVar14;
              puts("\n3-species chemical kinetics problem");
              local_1a8 = p_Var6;
              local_180 = plVar7;
              if (local_1c4 == 0) {
                p_Var6 = (N_Vector)0x0;
                pcVar12 = "Sensitivity: NO ";
                p_Var10 = (N_Vector)0x0;
LAB_0010296c:
                printf(pcVar12);
                plVar7 = (long *)N_VNew_Serial(2,local_1b8);
                puVar16 = *(undefined8 **)(*plVar7 + 0x10);
                *puVar16 = 0;
                puVar16[1] = 0;
                IDAQuadInit(local_1d0,rhsQ,plVar7);
                local_178 = plVar7;
                if (local_1c4 == 0) {
                  local_1b0 = (undefined8 *)0x0;
                }
                else {
                  local_1b0 = (undefined8 *)N_VCloneVectorArray(3,plVar7);
                  lVar9 = 0;
                  do {
                    N_VConst(0,local_1b0[lVar9]);
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  IDAQuadSensInit(local_1d0,0,local_1b0);
                }
                uVar4 = IDACalcIC(0x9999999a,local_1d0,1);
                yp = local_1a8;
                if ((int)uVar4 < 0) {
                  pcVar12 = "IDACalcIC";
                }
                else {
                  local_188 = p_Var10;
                  uVar4 = IDAGetConsistentIC(local_1d0,y,local_1a8);
                  if (-1 < (int)uVar4) {
                    local_190 = puVar5;
                    PrintIC(y,yp);
                    p_Var10 = local_188;
                    if (local_1c4 != 0) {
                      IDAGetSensConsistentIC(local_1d0,p_Var6,local_188);
                      PrintSensIC(p_Var6,p_Var10,yS,ypS);
                    }
                    puts("\n");
                    printf("===========================================");
                    puts("============================");
                    printf("     T     Q       H      NST           y1");
                    puts("           y2           y3    ");
                    printf("===========================================");
                    puts("============================");
                    iVar3 = 0xc;
                    dVar2 = 0.4;
                    do {
                      local_1a0 = dVar2;
                      uVar4 = IDASolve(local_1d0,&local_198,y,local_1a8,1);
                      if ((int)uVar4 < 0) {
                        pcVar12 = "IDASolve";
LAB_00103019:
                        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar12
                                ,(ulong)uVar4);
                        break;
                      }
                      PrintOutput(local_1d0,local_198,y);
                      if (local_1c4 != 0) {
                        uVar4 = IDAGetSens(local_1d0,&local_198,p_Var6);
                        if ((int)uVar4 < 0) {
                          pcVar12 = "IDAGetSens";
                          goto LAB_00103019;
                        }
                        PrintSensOutput((N_Vector *)p_Var6);
                      }
                      printf("-----------------------------------------");
                      puts("------------------------------");
                      dVar2 = local_1a0 * 10.0;
                      iVar3 = iVar3 + -1;
                    } while (iVar3 != 0);
                    puts("\nQuadrature:");
                    plVar7 = local_178;
                    IDAGetQuad(local_1d0,&local_198,local_178);
                    printf("G:      %10.4e\n",(int)**(undefined8 **)(*plVar7 + 0x10));
                    puVar5 = local_1b0;
                    if (local_1c4 == 0) {
                      puts("\nFinal Statistics:");
                      IDAPrintAllStats(local_1d0,_stdout,0);
                      builtin_strncpy(local_138,"idasRobe",8);
                      uStack_130._0_2_ = 0x7472;
                      uStack_130._2_6_ = 0x5f4153465f73;
                      uStack_128 = 0x6e64;
                      builtin_strncpy(acStack_126,"s_stats",8);
                      puVar5 = local_1b0;
                      plVar7 = local_180;
                      puVar16 = local_190;
                    }
                    else {
                      IDAGetQuadSens(local_1d0,&local_198,local_1b0);
                      printf("\nSensitivities at t=%g:\n",local_198._0_4_);
                      printf("dG/dp1: %11.4e\n",(int)**(undefined8 **)(*(long *)*puVar5 + 0x10));
                      printf("dG/dp1: %11.4e\n",(int)**(undefined8 **)(*(long *)puVar5[1] + 0x10));
                      printf("dG/dp1: %11.4e\n",(int)**(undefined8 **)(*(long *)puVar5[2] + 0x10));
                      puts("\nFinal Statistics:");
                      IDAPrintAllStats(local_1d0,_stdout,0);
                      builtin_strncpy(local_138,"idasRobe",8);
                      uStack_130._0_2_ = 0x7472;
                      uStack_130._2_6_ = 0x5f4153465f73;
                      uStack_128 = 0x6e64;
                      builtin_strncpy(acStack_126,"s_stats",8);
                      sVar11 = strlen(local_138);
                      plVar7 = local_180;
                      puVar16 = local_190;
                      uVar13 = local_1c0;
                      if (local_1bc == 1) {
                        builtin_strncpy(local_138 + sVar11,"_-sensi_",8);
                        *(undefined4 *)((long)&uStack_130 + sVar11) = 0x6d6973;
                      }
                      else {
                        builtin_strncpy(local_138 + sVar11,"_-sensi_",8);
                        *(undefined4 *)((long)&uStack_130 + sVar11) = 0x677473;
                      }
                      sVar11 = strlen(local_138);
                      pcVar12 = local_138 + sVar11;
                      if ((char)uVar13 == '\0') {
                        local_138[sVar11 + 2] = '\0';
                        pcVar12[0] = '_';
                        pcVar12[1] = 't';
                      }
                      else {
                        local_138[sVar11 + 2] = '\0';
                        pcVar12[0] = '_';
                        pcVar12[1] = 'f';
                      }
                    }
                    sVar11 = strlen(local_138);
                    builtin_strncpy(local_138 + sVar11,".csv",5);
                    __stream = fopen(local_138,"w");
                    IDAPrintAllStats(local_1d0,__stream,1);
                    fclose(__stream);
                    N_VDestroy(y);
                    N_VDestroy(local_1a8);
                    N_VDestroy(plVar7);
                    N_VDestroy(local_160);
                    N_VDestroy(local_178);
                    if (local_1c4 != 0) {
                      N_VDestroyVectorArray(p_Var6,3);
                      N_VDestroyVectorArray(local_188,3);
                      N_VDestroyVectorArray(puVar5,3);
                    }
                    free(puVar16);
                    IDAFree(&local_1d0);
                    SUNLinSolFree(local_170);
                    SUNMatDestroy(local_168);
                    SUNContext_Free(&local_1b8);
                    return 0;
                  }
                  pcVar12 = "IDAGetConsistentIC";
                }
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar12,
                        (ulong)uVar4);
                return 1;
              }
              local_158 = *puVar5;
              uStack_150 = puVar5[1];
              local_148 = puVar5[2];
              p_Var6 = (N_Vector)N_VCloneVectorArray(3,y);
              if (p_Var6 == (N_Vector)0x0) {
                main_cold_2();
                return 1;
              }
              lVar9 = 0;
              do {
                N_VConst(0,(&p_Var6->content)[lVar9]);
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              p_Var10 = (N_Vector)N_VCloneVectorArray(3,y);
              if (p_Var10 == (N_Vector)0x0) {
                main_cold_1();
                return 1;
              }
              lVar9 = 0;
              do {
                N_VConst(0,(&p_Var10->content)[lVar9]);
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              uVar4 = IDASensInit(local_1d0,3,local_1bc,resS,p_Var6,p_Var10);
              if ((int)uVar4 < 0) {
                pcVar12 = "IDASensInit";
              }
              else {
                uVar4 = IDASensEEtolerances(local_1d0);
                if ((int)uVar4 < 0) {
                  pcVar12 = "IDASensEEtolerances";
                }
                else {
                  uVar4 = IDASetSensErrCon(local_1d0,(ulong)local_1a0 & 0xffffffff);
                  if ((int)uVar4 < 0) {
                    pcVar12 = "IDASetSensErrCon";
                  }
                  else {
                    ypS = (N_Vector *)0x0;
                    uVar4 = IDASetSensParams(local_1d0,puVar5,&local_158);
                    if (-1 < (int)uVar4) {
                      printf("Sensitivity: YES ");
                      pcVar12 = "( STAGGERED +";
                      if (local_1bc == 1) {
                        pcVar12 = "( SIMULTANEOUS +";
                      }
                      printf(pcVar12);
                      pcVar12 = " FULL ERROR CONTROL )";
                      if ((char)local_1c0 != '\0') {
                        pcVar12 = " PARTIAL ERROR CONTROL )";
                      }
                      goto LAB_0010296c;
                    }
                    pcVar12 = "IDASetSensParams";
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar12,(ulong)uVar4);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext ctx;
  void* ida_mem;
  SUNMatrix A;
  SUNLinearSolver LS;
  UserData data;
  sunrealtype reltol, t, tout;
  N_Vector y, yp, abstol, id;
  int iout, retval;
  FILE* FID;
  char fname[256];

  sunrealtype pbar[NS];
  int is;
  N_Vector *yS, *ypS;
  sunbooleantype sensi, err_con;
  int sensi_meth;

  N_Vector yQ, *yQS;

  ida_mem = NULL;
  A       = NULL;
  LS      = NULL;
  data    = NULL;
  y       = NULL;
  yS      = NULL;
  ypS     = NULL;
  yQS     = NULL;

  /* Process arguments */
  ProcessArgs(argc, argv, &sensi, &sensi_meth, &err_con);

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* User data structure */
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }
  data->p[0] = SUN_RCONST(0.040);
  data->p[1] = SUN_RCONST(1.0e4);
  data->p[2] = SUN_RCONST(3.0e7);
  data->coef = SUN_RCONST(0.5);

  /* Initial conditions */
  y = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  Ith(y, 1) = ONE;
  Ith(y, 2) = ZERO;
  Ith(y, 3) = ZERO;

  yp = N_VClone(y);
  if (check_retval((void*)yp, "N_VNew_Serial", 0)) { return (1); }

  /* These initial conditions are NOT consistent. See IDACalcIC below. */
  Ith(yp, 1) = SUN_RCONST(0.1);
  Ith(yp, 2) = ZERO;
  Ith(yp, 3) = ZERO;

  /* Create IDAS object */
  ida_mem = IDACreate(ctx);
  if (check_retval((void*)ida_mem, "IDACreate", 0)) { return (1); }

  /* Allocate space for IDAS */
  retval = IDAInit(ida_mem, res, T0, y, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  /* Specify scalar relative tol. and vector absolute tol. */
  reltol         = SUN_RCONST(1.0e-6);
  abstol         = N_VClone(y);
  Ith(abstol, 1) = SUN_RCONST(1.0e-8);
  Ith(abstol, 2) = SUN_RCONST(1.0e-14);
  Ith(abstol, 3) = SUN_RCONST(1.0e-6);
  retval         = IDASVtolerances(ida_mem, reltol, abstol);
  if (check_retval(&retval, "IDASVtolerances", 1)) { return (1); }

  /* Set ID vector */
  id         = N_VClone(y);
  Ith(id, 1) = 1.0;
  Ith(id, 2) = 1.0;
  Ith(id, 3) = 0.0;
  retval     = IDASetId(ida_mem, id);
  if (check_retval(&retval, "IDASetId", 1)) { return (1); }

  /* Attach user data */
  retval = IDASetUserData(ida_mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(y, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(ida_mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  printf("\n3-species chemical kinetics problem\n");

  /* Sensitivity-related settings */
  if (sensi)
  {
    pbar[0] = data->p[0];
    pbar[1] = data->p[1];
    pbar[2] = data->p[2];

    yS = N_VCloneVectorArray(NS, y);
    if (check_retval((void*)yS, "N_VCloneVectorArray", 0)) { return (1); }
    for (is = 0; is < NS; is++) { N_VConst(ZERO, yS[is]); }

    ypS = N_VCloneVectorArray(NS, y);
    if (check_retval((void*)ypS, "N_VCloneVectorArray", 0)) { return (1); }
    for (is = 0; is < NS; is++) { N_VConst(ZERO, ypS[is]); }

    /*
    * Only non-zero sensitivity I.C. are ypS[0]:
    * - Ith(ypS[0],1) = -ONE;
    * - Ith(ypS[0],2) =  ONE;
    *
    * They are not set. IDACalcIC also computes consistent IC for sensitivities.
    */

    retval = IDASensInit(ida_mem, NS, sensi_meth, resS, yS, ypS);
    if (check_retval(&retval, "IDASensInit", 1)) { return (1); }

    retval = IDASensEEtolerances(ida_mem);
    if (check_retval(&retval, "IDASensEEtolerances", 1)) { return (1); }

    retval = IDASetSensErrCon(ida_mem, err_con);
    if (check_retval(&retval, "IDASetSensErrCon", 1)) { return (1); }

    retval = IDASetSensParams(ida_mem, data->p, pbar, NULL);
    if (check_retval(&retval, "IDASetSensParams", 1)) { return (1); }

    printf("Sensitivity: YES ");
    if (sensi_meth == IDA_SIMULTANEOUS) { printf("( SIMULTANEOUS +"); }
    else { printf("( STAGGERED +"); }
    if (err_con) { printf(" FULL ERROR CONTROL )"); }
    else { printf(" PARTIAL ERROR CONTROL )"); }
  }
  else { printf("Sensitivity: NO "); }

  /*----------------------------------------------------------
   *               Q U A D R A T U R E S
   * ---------------------------------------------------------*/
  yQ = N_VNew_Serial(2, ctx);

  Ith(yQ, 1) = 0;
  Ith(yQ, 2) = 0;

  IDAQuadInit(ida_mem, rhsQ, yQ);

  if (sensi)
  {
    yQS = N_VCloneVectorArray(NS, yQ);
    for (is = 0; is < NS; is++) { N_VConst(ZERO, yQS[is]); }

    IDAQuadSensInit(ida_mem, NULL, yQS);
  }

  /* Call IDACalcIC to compute consistent initial conditions. If sensitivity is
     enabled, this function also try to find consistent IC for the sensitivities. */

  retval = IDACalcIC(ida_mem, IDA_YA_YDP_INIT, T1);
  ;
  if (check_retval(&retval, "IDACalcIC", 1)) { return (1); }

  retval = IDAGetConsistentIC(ida_mem, y, yp);
  if (check_retval(&retval, "IDAGetConsistentIC", 1)) { return (1); }

  PrintIC(y, yp);

  if (sensi)
  {
    IDAGetSensConsistentIC(ida_mem, yS, ypS);
    PrintSensIC(y, yp, yS, ypS);
  }

  /* In loop over output points, call IDA, print results, test for error */

  printf("\n\n");
  printf("===========================================");
  printf("============================\n");
  printf("     T     Q       H      NST           y1");
  printf("           y2           y3    \n");
  printf("===========================================");
  printf("============================\n");

  for (iout = 1, tout = T1; iout <= NOUT; iout++, tout *= TMULT)
  {
    retval = IDASolve(ida_mem, tout, &t, y, yp, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { break; }

    PrintOutput(ida_mem, t, y);

    if (sensi)
    {
      retval = IDAGetSens(ida_mem, &t, yS);
      if (check_retval(&retval, "IDAGetSens", 1)) { break; }
      PrintSensOutput(yS);
    }
    printf("-----------------------------------------");
    printf("------------------------------\n");
  }

  printf("\nQuadrature:\n");
  IDAGetQuad(ida_mem, &t, yQ);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("G:      %10.4Le\n", Ith(yQ, 1));
#else
  printf("G:      %10.4e\n", Ith(yQ, 1));
#endif

  if (sensi)
  {
    IDAGetQuadSens(ida_mem, &t, yQS);
#if defined(SUNDIALS_EXTENDED_PRECISION)
    printf("\nSensitivities at t=%Lg:\n", t);
    printf("dG/dp1: %11.4Le\n", Ith(yQS[0], 1));
    printf("dG/dp1: %11.4Le\n", Ith(yQS[1], 1));
    printf("dG/dp1: %11.4Le\n", Ith(yQS[2], 1));
#else
    printf("\nSensitivities at t=%g:\n", t);
    printf("dG/dp1: %11.4e\n", Ith(yQS[0], 1));
    printf("dG/dp1: %11.4e\n", Ith(yQS[1], 1));
    printf("dG/dp1: %11.4e\n", Ith(yQS[2], 1));
#endif
  }

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = IDAPrintAllStats(ida_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  strcpy(fname, "idasRoberts_FSA_dns_stats");
  if (sensi)
  {
    if (sensi_meth == IDA_SIMULTANEOUS) { strcat(fname, "_-sensi_sim"); }
    else { strcat(fname, "_-sensi_stg"); }
    if (err_con) { strcat(fname, "_t"); }
    else { strcat(fname, "_f"); }
  }
  strcat(fname, ".csv");
  FID    = fopen(fname, "w");
  retval = IDAPrintAllStats(ida_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Free memory */
  N_VDestroy(y);
  N_VDestroy(yp);
  N_VDestroy(abstol);
  N_VDestroy(id);
  N_VDestroy(yQ);
  if (sensi)
  {
    N_VDestroyVectorArray(yS, NS);
    N_VDestroyVectorArray(ypS, NS);
    N_VDestroyVectorArray(yQS, NS);
  }
  free(data);
  IDAFree(&ida_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNContext_Free(&ctx);

  return (0);
}